

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O1

btVector3 __thiscall btTransform::invXform(btTransform *this,btVector3 *inVec)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  btVector3 bVar7;
  
  fVar4 = inVec->m_floats[0] - (this->m_origin).m_floats[0];
  fVar6 = inVec->m_floats[1] - (this->m_origin).m_floats[1];
  fVar5 = inVec->m_floats[2] - (this->m_origin).m_floats[2];
  bVar7.m_floats[0] =
       (this->m_basis).m_el[2].m_floats[0] * fVar5 +
       (this->m_basis).m_el[0].m_floats[0] * fVar4 + (this->m_basis).m_el[1].m_floats[0] * fVar6;
  uVar1 = *(undefined8 *)((this->m_basis).m_el[0].m_floats + 1);
  uVar2 = *(undefined8 *)((this->m_basis).m_el[1].m_floats + 1);
  uVar3 = *(undefined8 *)((this->m_basis).m_el[2].m_floats + 1);
  bVar7.m_floats[1] = fVar5 * (float)uVar3 + fVar4 * (float)uVar1 + fVar6 * (float)uVar2;
  bVar7.m_floats[2] =
       fVar5 * (float)((ulong)uVar3 >> 0x20) +
       fVar4 * (float)((ulong)uVar1 >> 0x20) + fVar6 * (float)((ulong)uVar2 >> 0x20);
  bVar7.m_floats[3] = 0.0;
  return (btVector3)bVar7.m_floats;
}

Assistant:

SIMD_FORCE_INLINE btVector3
operator-(const btVector3& v1, const btVector3& v2)
{
#if defined BT_USE_SIMD_VECTOR3 && (defined(BT_USE_SSE_IN_API)  && defined(BT_USE_SSE))

	//	without _mm_and_ps this code causes slowdown in Concave moving
	__m128 r = _mm_sub_ps(v1.mVec128, v2.mVec128);
	return btVector3(_mm_and_ps(r, btvFFF0fMask));
#elif defined(BT_USE_NEON)
	float32x4_t r = vsubq_f32(v1.mVec128, v2.mVec128);
	return btVector3((float32x4_t)vandq_s32((int32x4_t)r, btvFFF0Mask));
#else
	return btVector3(
			v1.m_floats[0] - v2.m_floats[0],
			v1.m_floats[1] - v2.m_floats[1],
			v1.m_floats[2] - v2.m_floats[2]);
#endif
}